

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.hpp
# Opt level: O1

void __thiscall
nestl::test::allocator_with_state<int>::allocator_with_state
          (allocator_with_state<int> *this,allocator_with_state<int> *other)

{
  shared_count_base *psVar1;
  bool bVar2;
  
  (this->m_allocated_storage).m_ptr = (element_type *)0x0;
  (this->m_allocated_storage).m_refcount = (shared_count_base *)0x0;
  (this->m_allocated_storage).m_ptr = (other->m_allocated_storage).m_ptr;
  (other->m_allocated_storage).m_ptr = (element_type *)0x0;
  psVar1 = (this->m_allocated_storage).m_refcount;
  (this->m_allocated_storage).m_refcount = (other->m_allocated_storage).m_refcount;
  (other->m_allocated_storage).m_refcount = psVar1;
  bVar2 = impl::shared_ptr::operator_cast_to_bool((shared_ptr *)other);
  if (!bVar2) {
    return;
  }
  __assert_fail("!other.m_allocated_storage",
                "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/tests/allocators.hpp"
                ,0x82,
                "nestl::test::allocator_with_state<int>::allocator_with_state(allocator_with_state<T> &&) [T = int]"
               );
}

Assistant:

allocator_with_state(allocator_with_state&& other) NESTL_NOEXCEPT_SPEC
        : m_allocated_storage(std::move(other.m_allocated_storage))
    {
        assert(!other.m_allocated_storage);
    }